

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

int main(void)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  char cVar1;
  byte bVar2;
  bool bVar3;
  undefined1 *puVar4;
  Namespace *o;
  LineAndColumn LVar5;
  ostream *this;
  char *__str_00;
  char *pcVar6;
  char *pcVar7;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  long in_FS_OFFSET;
  AbortCompilationException ex;
  undefined1 auStack_450 [8];
  string_view str;
  uint local_420;
  uint uStack_41c;
  LineAndColumn start;
  TokenType local_410;
  TokenType type;
  string_view last;
  UTF8Reader lastPos;
  CodeLocation loc;
  SimpleTokeniser tokenizer;
  CompileMessageHandler handler;
  CompileMessageList errors;
  CodeLocation location;
  undefined1 local_2f0 [8];
  SourceFile sourceFile;
  pool_ptr<soul::AST::Namespace> topLevelNamespace;
  Allocator allocator;
  string local_238 [8];
  string inputText;
  ifstream input;
  
  std::ifstream::ifstream((void *)((long)&inputText.field_2 + 8),"../test/ringtone.soul",_S_in);
  std::__cxx11::string::string(local_238);
  do {
    cVar1 = std::istream::get();
    std::__cxx11::string::operator+=(local_238,cVar1);
    bVar2 = std::ios::eof();
  } while (((bVar2 ^ 0xff) & 1) != 0);
  std::__cxx11::string::size();
  puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_238);
  *puVar4 = 0;
  soul::AST::Allocator::Allocator((Allocator *)&topLevelNamespace);
  o = soul::AST::createRootNamespace((Allocator *)&topLevelNamespace);
  soul::pool_ptr<soul::AST::Namespace>::pool_ptr<soul::AST::Namespace,void>
            ((pool_ptr<soul::AST::Namespace> *)((long)&sourceFile.content.field_2 + 8),o);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f0,"ringtone.soul",
             (allocator<char> *)((long)&location.location.data + 7));
  std::__cxx11::string::string((string *)(sourceFile.filename.field_2._M_local_buf + 8),local_238);
  std::allocator<char>::~allocator((allocator<char> *)((long)&location.location.data + 7));
  soul::CodeLocation::createFromSourceFile
            ((CodeLocation *)
             &errors.messages.
              super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(SourceFile *)local_2f0);
  soul::CompileMessageList::CompileMessageList((CompileMessageList *)&handler.lastHandler);
  soul::CompileMessageHandler::CompileMessageHandler
            ((CompileMessageHandler *)&tokenizer.super_SOULTokeniser.literalType,
             (CompileMessageList *)&handler.lastHandler);
  *(TokenType **)(in_FS_OFFSET + -8) = &tokenizer.super_SOULTokeniser.literalType;
  soul::SimpleTokeniser::SimpleTokeniser
            ((SimpleTokeniser *)&loc.location,
             (CodeLocation *)
             &errors.messages.
              super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,true);
  soul::CodeLocation::getOffset((CodeLocation *)&lastPos,(int)&errors + 0x30,0x19);
  soul::UTF8Reader::UTF8Reader
            ((UTF8Reader *)&last._M_str,(UTF8Reader *)&tokenizer.super_SOULTokeniser.startLocation);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&type);
  soul::TokenType::TokenType(&local_410);
  do {
    bVar3 = soul::
            Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                       *)&loc.location,(TokenType)"$eof");
    if (((bVar3 ^ 0xffU) & 1) == 0) {
LAB_003289f9:
      soul::CodeLocation::~CodeLocation((CodeLocation *)&lastPos);
      soul::SimpleTokeniser::~SimpleTokeniser((SimpleTokeniser *)&loc.location);
      soul::CompileMessageHandler::~CompileMessageHandler
                ((CompileMessageHandler *)&tokenizer.super_SOULTokeniser.literalType);
      soul::CompileMessageList::~CompileMessageList((CompileMessageList *)&handler.lastHandler);
      soul::CodeLocation::~CodeLocation
                ((CodeLocation *)
                 &errors.messages.
                  super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      soul::SourceFile::~SourceFile((SourceFile *)local_2f0);
      soul::pool_ptr<soul::AST::Namespace>::~pool_ptr
                ((pool_ptr<soul::AST::Namespace> *)((long)&sourceFile.content.field_2 + 8));
      soul::AST::Allocator::~Allocator((Allocator *)&topLevelNamespace);
      std::__cxx11::string::~string(local_238);
      std::ifstream::~ifstream((void *)((long)&inputText.field_2 + 8));
      return 0;
    }
    LVar5 = soul::CodeLocation::getLineAndColumn
                      ((CodeLocation *)&tokenizer.super_SOULTokeniser.startLocation.location);
    local_420 = LVar5.line;
    if ((10 < local_420) && (uStack_41c = LVar5.column, 7 < uStack_41c)) {
      soul::TokenType::getDescription_abi_cxx11_((string *)&str._M_str,&local_410);
      this = std::operator<<((ostream *)&std::cout,(string *)&str._M_str);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&str._M_str);
      __str_00 = soul::UTF8Reader::getAddress((UTF8Reader *)&last._M_str);
      pcVar6 = soul::UTF8Reader::getAddress((UTF8Reader *)&tokenizer.super_SOULTokeniser.location);
      pcVar7 = soul::UTF8Reader::getAddress((UTF8Reader *)&last._M_str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_450,__str_00,
                 (long)pcVar6 - (long)pcVar7);
      __str._M_str = (char *)str._M_len;
      __str._M_len = (size_t)auStack_450;
      this_00 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,__str);
      std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
      goto LAB_003289f9;
    }
    local_410.text = tokenizer.super_SOULTokeniser.location.location.data;
    soul::UTF8Reader::operator=
              ((UTF8Reader *)&last._M_str,(UTF8Reader *)&tokenizer.super_SOULTokeniser.location);
    soul::
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            *)&loc.location);
  } while( true );
}

Assistant:

int main()
{
    std::ifstream input("../test/ringtone.soul", std::ios::in);
    std::string inputText;
    do
    {
        inputText += input.get();
    } while (!input.eof());
    inputText[inputText.size() - 1] = 0;

    soul::AST::Allocator allocator;
    soul::pool_ptr<soul::AST::Namespace> topLevelNamespace = soul::AST::createRootNamespace(allocator);
    auto sourceFile = soul::SourceFile{"ringtone.soul", inputText};
    soul::CodeLocation location = soul::CodeLocation::createFromSourceFile(sourceFile);

    CompileMessageList errors;
    CompileMessageHandler handler(errors);
    soul::messageHandler = &handler;
    try
    {
        // auto ast = soul::Compiler::parseTopLevelDeclarations(allocator, location, *topLevelNamespace);

        // struct Visitor : public ASTVisitor
        // {
        // public:
        //     void visitObject(AST::ModuleBase &base)
        //     {
        //         ASTVisitor::visitObject(base);
        //     }
        //     void visit(AST::Block &b)
        //     {
        //         ASTVisitor::visit(b);
        //         auto range = SourceCodeUtilities::iterateSyntaxTokens(b);
        //         auto start = range.start.getLineAndColumn();
        //         auto end = range.end.getLineAndColumn();
        //         std::cout << start.line << " " << start.column << std::endl;
        //         std::cout << end.line << " " << end.column << std::endl;
        //     }

        //     std::vector<Definition> definitions;
        //     std::vector<Definition> references;
        //     pool_ptr<CodeLocation> location;
        // };

        // Visitor test;
        // test.location = location;
        // test.visitObject(ast[0].get());

        SimpleTokeniser tokenizer(location, true);
        auto loc = location.getOffset(25, 20);
        auto lastPos = tokenizer.startLocation.location;
        std::string_view last;
        TokenType type;

        while (!tokenizer.matches(Token::eof))
        {
            auto start = tokenizer.location.getLineAndColumn();
            if (start.line >= 11 && start.column > 7)
            {
                std::cout << type.getDescription() << std::endl;
                std::string_view str(
                    lastPos.getAddress(), tokenizer.location.location.getAddress() - lastPos.getAddress());
                std::cout << str << std::endl;
                break;
            }
            type = tokenizer.currentType;
            lastPos = tokenizer.location.location;
            tokenizer.skip();
        }

        // SourceCodeUtilities::findASTObjectAt(*ast[0].get().getAsBlock(), location.getOffset(25, 20));
        // for (auto fn : ast[0].get().getFunctions())
        // {
        //     // auto obj = SourceCodeUtilities::findASTObjectAt(fn.get(), location.getOffset(25, 20));
        // }

        // for (auto def : test.definitions)
        // {
        //     auto start = def.start.getLineAndColumn();
        //     std::cout << "D" << start.line << ":" << start.column << "-" << start.column + def.name.size() << ":" << def.name << std::endl;
        // }

        // for (auto def : test.references)
        // {
        //     auto start = def.start.getLineAndColumn();
        //     std::cout << "R" << start.line << ":" << start.column << "-" << start.column + def.name.size() << ":" << def.name << std::endl;
        // }

        // if (found != nullptr)
        // {
        // }
        // else
        // {
        //     std::cout << "No results found" << std::endl;
        // }
    }
    catch (AbortCompilationException ex)
    {
        std::cout << errors.toString() << std::endl;
    }
}